

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::TableFunctionData::Copy(TableFunctionData *this)

{
  InternalException *this_00;
  string local_40;
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Copy not supported for TableFunctionData","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> TableFunctionData::Copy() const {
	throw InternalException("Copy not supported for TableFunctionData");
}